

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.c
# Opt level: O0

void do_incchr(int *ip)

{
  int iVar1;
  int local_5c;
  int size;
  int total;
  int ty;
  int tx;
  int h;
  int w;
  int y;
  int x;
  int j;
  int i;
  uchar buffer [32];
  int *ip_local;
  
  local_5c = 0;
  labldef(loccnt,1);
  if (pass == 1) {
    loadlc(loccnt,0);
  }
  iVar1 = pcx_get_args(ip);
  if ((iVar1 != 0) && (iVar1 = pcx_parse_args(0,pcx_nb_args,&w,&h,&tx,&ty,8), iVar1 != 0)) {
    for (x = 0; x < ty; x = x + 1) {
      for (y = 0; y < tx; y = y + 1) {
        iVar1 = pcx_pack_8x8_tile((uchar *)&j,w + y * 8,h + x * 8);
        local_5c = iVar1 + local_5c;
        putbuffer(&j,iVar1);
      }
    }
    if (lablptr == (t_symbol *)0x0) {
      if ((lastlabl != (t_symbol *)0x0) && (lastlabl->data_type == 9)) {
        lastlabl->data_size = local_5c + lastlabl->data_size;
      }
    }
    else {
      lablptr->data_type = 9;
      lablptr->data_size = local_5c;
    }
    if (pass == 1) {
      println();
    }
  }
  return;
}

Assistant:

void
do_incchr(int *ip)
{
	unsigned char buffer[32];
	int i, j;
	int x, y, w, h;
	int tx, ty;
	int total = 0;
	int size;

	/* define label */
	labldef(loccnt, 1);

	/* output */
	if (pass == LAST_PASS)
		loadlc(loccnt, 0);

	/* get args */
	if (!pcx_get_args(ip))
		return;
	if (!pcx_parse_args(0, pcx_nb_args, &x, &y, &w, &h, 8))
		return;

	/* pack data */
	for (i = 0; i < h; i++) {
		for (j = 0; j < w; j++) {
			/* tile coordinates */
			tx = x + (j << 3);
			ty = y + (i << 3);

			/* get tile */
			size   = pcx_pack_8x8_tile(buffer, tx, ty);
			total += size;

			/* store tile */
			putbuffer(buffer, size);
		}
	}

	/* size */
	if (lablptr) {
		lablptr->data_type = P_INCCHR;
		lablptr->data_size = total;
	}
	else {
		if (lastlabl) {
			if (lastlabl->data_type == P_INCCHR)
				lastlabl->data_size += total;
		}
	}

	/* output */
	if (pass == LAST_PASS)
		println();
}